

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O2

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)

{
  _Bool _Var1;
  STRING_HANDLE s2;
  XIO_HANDLE xio;
  int iVar2;
  LIST_ITEM_HANDLE item_handle;
  int *__ptr;
  size_t size;
  char *pcVar3;
  size_t sVar4;
  STRING_HANDLE s1;
  LOGGER_LOG p_Var5;
  char *pcVar6;
  char *pcVar7;
  uchar *buffer;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  ulong __size;
  LOGGER_LOG local_70;
  char *local_68;
  
  if ((handle != (HTTP_CLIENT_HANDLE)0x0) &&
     (xio_dowork(handle->xio_handle), handle->connected == 1)) {
    while( true ) {
      __size = 0xffffffffffffffff;
      item_handle = singlylinkedlist_get_head_item(handle->data_list);
      if (item_handle == (LIST_ITEM_HANDLE)0x0) break;
      __ptr = (int *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr != (int *)0x0) {
        size = BUFFER_length(*(BUFFER_HANDLE *)(__ptr + 6));
        iVar2 = *__ptr;
        pcVar3 = STRING_c_str(*(STRING_HANDLE *)(__ptr + 2));
        if (iVar2 - 1U < 6) {
          s2 = *(STRING_HANDLE *)(__ptr + 4);
          pcVar15 = (&PTR_anon_var_dwarf_1049_0011fcf8)[iVar2 - 1U];
          sVar4 = strlen(pcVar15);
          uVar13 = __size;
          if (sVar4 < 0xfffffffffffffff0) {
            uVar13 = sVar4 + 0x10;
          }
          sVar4 = strlen(pcVar3);
          uVar9 = __size;
          if (!CARRY8(sVar4,uVar13)) {
            uVar9 = sVar4 + uVar13;
          }
          if (uVar9 + 1 != 0) {
            __size = uVar9 + 1;
          }
          if ((__size == 0xffffffffffffffff) ||
             (pcVar3 = (char *)malloc(__size), pcVar3 == (char *)0x0)) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              iVar2 = 0x3f9;
              pcVar3 = "Failure allocating Request data, size:%zu";
              goto LAB_00105a9c;
            }
            goto LAB_00105aa1;
          }
          iVar2 = snprintf(pcVar3,__size,"%s %s HTTP/1.1\r\n",pcVar15);
          if (iVar2 < 1) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"construct_http_data",0x400,1,"Failure writing request buffer");
            }
            s1 = (STRING_HANDLE)0x0;
          }
          else {
            s1 = STRING_construct(pcVar3);
            if (s1 == (STRING_HANDLE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                iVar2 = 0x407;
                pcVar15 = "Failure creating buffer object";
LAB_00105bbc:
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                          ,"construct_http_data",iVar2,1,pcVar15);
              }
            }
            else {
              iVar2 = STRING_concat_with_STRING(s1,s2);
              if (iVar2 == 0) goto LAB_00105bc4;
              STRING_delete(s1);
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                iVar2 = 0x40d;
                pcVar15 = "Failure writing request buffers";
                goto LAB_00105bbc;
              }
            }
            s1 = (STRING_HANDLE)0x0;
          }
LAB_00105bc4:
          free(pcVar3);
          if (s1 == (STRING_HANDLE)0x0) goto LAB_00105aa1;
          pcVar3 = STRING_c_str(s1);
          xio = handle->xio_handle;
          sVar4 = strlen(pcVar3);
          iVar2 = xio_send(xio,pcVar3,sVar4,send_complete_callback,(void *)0x0);
          if (iVar2 == 0) {
            if (handle->trace_on == true) {
              pcVar15 = strstr(pcVar3,"\r\nAuthorization:");
              pcVar6 = strstr(pcVar3,"\r\nProxy-Authorization:");
              iVar14 = (int)pcVar3;
              iVar8 = (int)pcVar15;
              if (pcVar15 == (char *)0x0) {
                if (pcVar6 != (char *)0x0) {
                  local_68 = (char *)0x0;
                  goto LAB_00105cf1;
                }
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",0x153,1,"%s",pcVar3);
                }
              }
              else {
                pcVar7 = strstr(pcVar15 + 1,"\r\n");
                local_68 = pcVar7;
                if (pcVar6 == (char *)0x0) {
                  if ((pcVar7 == (char *)0x0) ||
                     (local_70 = xlogging_get_log_function(), local_70 == (LOGGER_LOG)0x0))
                  goto LAB_00105efa;
                  uVar10 = iVar8 - iVar14;
                  sVar4 = strlen(pcVar3);
                  uVar12 = (int)sVar4 + (iVar14 - (int)pcVar7);
                  iVar8 = 0x15b;
                  pcVar15 = "%.*s \r\nAuthorization: *** %.*s";
                }
                else {
LAB_00105cf1:
                  pcVar7 = strstr(pcVar6 + 1,"\r\n");
                  iVar11 = (int)pcVar6;
                  iVar16 = (int)pcVar7;
                  if (pcVar15 != (char *)0x0) {
                    p_Var5 = xlogging_get_log_function();
                    if (pcVar15 < pcVar6) {
                      if (p_Var5 != (LOGGER_LOG)0x0) {
                        uVar10 = iVar8 - iVar14;
                        uVar12 = iVar11 - (int)local_68;
                        uVar17 = iVar16 - iVar14;
                        iVar8 = 0x16e;
                        pcVar6 = 
                        "%.*s \r\nAuthorization: *** %.*s \r\nProxy-Authorization: *** %.*s";
                        pcVar15 = local_68;
                        local_68 = pcVar7;
LAB_00105eb6:
                        (*p_Var5)(AZ_LOG_TRACE,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                                  ,"log_text_line",iVar8,1,pcVar6,(ulong)uVar10,pcVar3,(ulong)uVar12
                                  ,pcVar15,(ulong)uVar17,local_68);
                      }
                    }
                    else if (p_Var5 != (LOGGER_LOG)0x0) {
                      uVar10 = iVar11 - iVar14;
                      uVar12 = iVar8 - iVar16;
                      uVar17 = (int)local_68 - iVar14;
                      iVar8 = 0x175;
                      pcVar6 = "%.*s \r\nProxy-Authorization: *** %.*s \r\nAuthorization: *** %.*s";
                      pcVar15 = pcVar7;
                      goto LAB_00105eb6;
                    }
                    goto LAB_00105efa;
                  }
                  if ((pcVar7 == (char *)0x0) ||
                     (local_70 = xlogging_get_log_function(), local_70 == (LOGGER_LOG)0x0))
                  goto LAB_00105efa;
                  uVar10 = iVar11 - iVar14;
                  sVar4 = strlen(pcVar3);
                  uVar12 = (int)sVar4 + (iVar14 - iVar16);
                  iVar8 = 0x164;
                  pcVar15 = "%.*s \r\nProxy-Authorization: *** %.*s";
                }
                (*local_70)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",iVar8,1,pcVar15,(ulong)uVar10,pcVar3,(ulong)uVar12,
                            pcVar7);
              }
            }
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"write_text_line",0x180,1,"Failure calling xio_send.");
            }
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"send_http_data",0x426,1,"Failure writing request buffer");
            }
          }
LAB_00105efa:
          STRING_delete(s1);
          if (iVar2 != 0) goto LAB_00105ad3;
          if (size != 0) {
            buffer = BUFFER_u_char(*(BUFFER_HANDLE *)(__ptr + 6));
            iVar2 = xio_send(handle->xio_handle,buffer,size,send_complete_callback,(void *)0x0);
            if (iVar2 == 0) {
              if (handle->trace_on == true) {
                _Var1 = handle->trace_body;
                p_Var5 = xlogging_get_log_function();
                if (_Var1 == true) {
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_TRACE,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"write_data_line",0x19f,1,"len: %d\r\n%.*s\r\n",size,size,buffer);
                  }
                }
                else if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"write_data_line",0x1a3,1,"<data> len: %d\r\n",size);
                }
              }
              goto LAB_00105b17;
            }
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"write_data_line",0x193,1,"Failure calling xio_send.");
            }
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              iVar2 = 0x5b1;
              goto LAB_00105af5;
            }
            goto LAB_00105b05;
          }
        }
        else {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            iVar2 = 0x3eb;
            pcVar3 = "Invalid request method %s specified";
            __size = 0;
LAB_00105a9c:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_data",iVar2,1,pcVar3,__size);
          }
LAB_00105aa1:
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"send_http_data",0x41d,1,"Failure constructing http data");
          }
LAB_00105ad3:
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            iVar2 = 0x5a6;
LAB_00105af5:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_dowork",iVar2,1,"Failure writing content buffer");
          }
LAB_00105b05:
          if (handle->on_error != (ON_HTTP_ERROR_CALLBACK)0x0) {
            (*handle->on_error)(handle->error_user_ctx,HTTP_CALLBACK_REASON_SEND_FAILED);
          }
        }
LAB_00105b17:
        STRING_delete(*(STRING_HANDLE *)(__ptr + 2));
        BUFFER_delete(*(BUFFER_HANDLE *)(__ptr + 6));
        STRING_delete(*(STRING_HANDLE *)(__ptr + 4));
        free(__ptr);
      }
      singlylinkedlist_remove(handle->data_list,item_handle);
    }
  }
  return;
}

Assistant:

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)
{
    if (handle != NULL)
    {
        /* Codes_SRS_UHTTP_07_037: [http_client_dowork shall call the underlying xio_dowork function. ] */
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;
        xio_dowork(http_data->xio_handle);

        // Wait till I'm connected
        if (handle->connected == 1)
        {
            LIST_ITEM_HANDLE pending_list_item;
            /* Codes_SRS_UHTTP_07_016: [http_client_dowork shall iterate through the queued Data using the xio interface to send the http request in the following ways...] */
            while ((pending_list_item = singlylinkedlist_get_head_item(http_data->data_list)) != NULL)
            {
                HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)singlylinkedlist_item_get_value(pending_list_item);
                if (send_data != NULL)
                {
                    size_t content_len = BUFFER_length(send_data->content);
                    /* Codes_SRS_UHTTP_07_052: [uhttp_client_dowork shall call xio_send to transmits the header information... ] */
                    if (send_http_data(http_data, send_data->request_type, STRING_c_str(send_data->relative_path), send_data->header_line) != 0)
                    {
                        LogError("Failure writing content buffer");
                        if (http_data->on_error)
                        {
                            http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                        }
                    }
                    else if (content_len > 0)
                    {
                        /* Codes_SRS_UHTTP_07_053: [ Then uhttp_client_dowork shall use xio_send to transmit the content of the http request. ] */
                        if (write_data_line(http_data, BUFFER_u_char(send_data->content), content_len) != 0)
                        {
                            LogError("Failure writing content buffer");
                            if (http_data->on_error)
                            {
                                http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                            }
                        }
                    }

                    /* Codes_SRS_UHTTP_07_046: [ http_client_dowork shall free resouces queued to send to the http endpoint. ] */
                    STRING_delete(send_data->relative_path);
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    free(send_data);
                }
                (void)singlylinkedlist_remove(http_data->data_list, pending_list_item);
            }
        }
    }
}